

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

par_shapes_mesh * par_shapes_clone(par_shapes_mesh *mesh,par_shapes_mesh *clone)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  uint16_t *puVar4;
  long *in_FS_OFFSET;
  int old_clone_ntriangles;
  int old_clone_npoints;
  par_shapes_mesh *clone_local;
  par_shapes_mesh *mesh_local;
  
  _old_clone_ntriangles = clone;
  if (clone == (par_shapes_mesh *)0x0) {
    _old_clone_ntriangles =
         (par_shapes_mesh *)rf_calloc_wrapper(*(rf_allocator *)(*in_FS_OFFSET + -0x440),1,0x30);
  }
  iVar1 = _old_clone_ntriangles->npoints;
  _old_clone_ntriangles->npoints = mesh->npoints;
  pfVar3 = (float *)rf_realloc_wrapper(*(rf_allocator *)(*in_FS_OFFSET + -0x440),
                                       _old_clone_ntriangles->points,
                                       _old_clone_ntriangles->npoints * 0xc,iVar1 * 3);
  _old_clone_ntriangles->points = pfVar3;
  memcpy(_old_clone_ntriangles->points,mesh->points,(long)_old_clone_ntriangles->npoints * 0xc);
  iVar2 = _old_clone_ntriangles->ntriangles;
  _old_clone_ntriangles->ntriangles = mesh->ntriangles;
  puVar4 = (uint16_t *)
           rf_realloc_wrapper(*(rf_allocator *)(*in_FS_OFFSET + -0x440),
                              _old_clone_ntriangles->triangles,_old_clone_ntriangles->ntriangles * 6
                              ,iVar2 * 3);
  _old_clone_ntriangles->triangles = puVar4;
  memcpy(_old_clone_ntriangles->triangles,mesh->triangles,
         (long)_old_clone_ntriangles->ntriangles * 6);
  if (mesh->normals != (float *)0x0) {
    pfVar3 = (float *)rf_realloc_wrapper(*(rf_allocator *)(*in_FS_OFFSET + -0x440),
                                         _old_clone_ntriangles->normals,
                                         _old_clone_ntriangles->npoints * 0xc,iVar1 * 3);
    _old_clone_ntriangles->normals = pfVar3;
    memcpy(_old_clone_ntriangles->normals,mesh->normals,(long)_old_clone_ntriangles->npoints * 0xc);
  }
  if (mesh->tcoords != (float *)0x0) {
    pfVar3 = (float *)rf_realloc_wrapper(*(rf_allocator *)(*in_FS_OFFSET + -0x440),
                                         _old_clone_ntriangles->tcoords,
                                         _old_clone_ntriangles->npoints << 3,iVar1 * 3);
    _old_clone_ntriangles->tcoords = pfVar3;
    memcpy(_old_clone_ntriangles->tcoords,mesh->tcoords,(long)_old_clone_ntriangles->npoints << 3);
  }
  return _old_clone_ntriangles;
}

Assistant:

PARDEF par_shapes_mesh* par_shapes_clone(par_shapes_mesh const* mesh,
                                  par_shapes_mesh* clone)
{
    if (!clone) {
        clone = PAR_CALLOC(par_shapes_mesh, 1);
    }
    int old_clone_npoints = clone->npoints;
    clone->npoints = mesh->npoints;
    clone->points = PAR_REALLOC(float, clone->points, 3 * clone->npoints, 3 * old_clone_npoints);
    memcpy(clone->points, mesh->points, sizeof(float) * 3 * clone->npoints);
    int old_clone_ntriangles = clone->ntriangles;
    clone->ntriangles = mesh->ntriangles;
    clone->triangles = PAR_REALLOC(PAR_SHAPES_T, clone->triangles, 3 *
                                                                   clone->ntriangles, 3 * old_clone_ntriangles);
    memcpy(clone->triangles, mesh->triangles,
           sizeof(PAR_SHAPES_T) * 3 * clone->ntriangles);
    if (mesh->normals) {
        clone->normals = PAR_REALLOC(float, clone->normals, 3 * clone->npoints, 3 * old_clone_npoints);
        memcpy(clone->normals, mesh->normals,
               sizeof(float) * 3 * clone->npoints);
    }
    if (mesh->tcoords) {
        clone->tcoords = PAR_REALLOC(float, clone->tcoords, 2 * clone->npoints, 3 * old_clone_npoints);
        memcpy(clone->tcoords, mesh->tcoords,
               sizeof(float) * 2 * clone->npoints);
    }
    return clone;
}